

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_avx2.c
# Opt level: O1

void idct32_low1_avx2(__m256i *in,__m256i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined4 uVar1;
  __m256i alVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  
  iVar5 = 1 << ((char)bit - 1U & 0x1f);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + (long)bit * 0x100 + 0x1e0);
  auVar6._4_4_ = uVar1;
  auVar6._0_4_ = uVar1;
  auVar6._8_4_ = uVar1;
  auVar6._12_4_ = uVar1;
  auVar6._16_4_ = uVar1;
  auVar6._20_4_ = uVar1;
  auVar6._24_4_ = uVar1;
  auVar6._28_4_ = uVar1;
  auVar6 = vpmulld_avx2(auVar6,(undefined1  [32])*in);
  auVar8._4_4_ = iVar5;
  auVar8._0_4_ = iVar5;
  auVar8._8_4_ = iVar5;
  auVar8._12_4_ = iVar5;
  auVar8._16_4_ = iVar5;
  auVar8._20_4_ = iVar5;
  auVar8._24_4_ = iVar5;
  auVar8._28_4_ = iVar5;
  auVar6 = vpaddd_avx2(auVar6,auVar8);
  iVar3 = bd + 6 + (uint)(do_cols == 0) * 2;
  iVar5 = 0x8000;
  if (0xf < iVar3) {
    iVar5 = 1 << ((char)iVar3 - 1U & 0x1f);
  }
  auVar6 = vpsrad_avx2(auVar6,ZEXT416((uint)bit));
  if (do_cols == 0) {
    iVar5 = 10;
    if (10 < bd) {
      iVar5 = bd;
    }
    iVar3 = (1 << ((byte)out_shift & 0x1f)) >> 1;
    iVar4 = 0x20 << ((byte)iVar5 & 0x1f);
    auVar10._4_4_ = iVar3;
    auVar10._0_4_ = iVar3;
    auVar10._8_4_ = iVar3;
    auVar10._12_4_ = iVar3;
    auVar10._16_4_ = iVar3;
    auVar10._20_4_ = iVar3;
    auVar10._24_4_ = iVar3;
    auVar10._28_4_ = iVar3;
    iVar5 = -iVar4;
    auVar7._4_4_ = iVar5;
    auVar7._0_4_ = iVar5;
    auVar7._8_4_ = iVar5;
    auVar7._12_4_ = iVar5;
    auVar7._16_4_ = iVar5;
    auVar7._20_4_ = iVar5;
    auVar7._24_4_ = iVar5;
    auVar7._28_4_ = iVar5;
    iVar4 = iVar4 + -1;
    auVar9._4_4_ = iVar4;
    auVar9._0_4_ = iVar4;
    auVar9._8_4_ = iVar4;
    auVar9._12_4_ = iVar4;
    auVar9._16_4_ = iVar4;
    auVar9._20_4_ = iVar4;
    auVar9._24_4_ = iVar4;
    auVar9._28_4_ = iVar4;
    auVar6 = vpaddd_avx2(auVar6,auVar10);
    auVar6 = vpsrad_avx2(auVar6,ZEXT416((uint)out_shift));
  }
  else {
    iVar3 = -iVar5;
    iVar5 = iVar5 + -1;
    auVar7._4_4_ = iVar3;
    auVar7._0_4_ = iVar3;
    auVar7._8_4_ = iVar3;
    auVar7._12_4_ = iVar3;
    auVar7._16_4_ = iVar3;
    auVar7._20_4_ = iVar3;
    auVar7._24_4_ = iVar3;
    auVar7._28_4_ = iVar3;
    auVar9._4_4_ = iVar5;
    auVar9._0_4_ = iVar5;
    auVar9._8_4_ = iVar5;
    auVar9._12_4_ = iVar5;
    auVar9._16_4_ = iVar5;
    auVar9._20_4_ = iVar5;
    auVar9._24_4_ = iVar5;
    auVar9._28_4_ = iVar5;
  }
  auVar6 = vpmaxsd_avx2(auVar6,auVar7);
  alVar2 = (__m256i)vpminsd_avx2(auVar6,auVar9);
  *out = alVar2;
  out[1] = alVar2;
  out[2] = alVar2;
  out[3] = alVar2;
  out[4] = alVar2;
  out[5] = alVar2;
  out[6] = alVar2;
  out[7] = alVar2;
  out[8] = alVar2;
  out[9] = alVar2;
  out[10] = alVar2;
  out[0xb] = alVar2;
  out[0xc] = alVar2;
  out[0xd] = alVar2;
  out[0xe] = alVar2;
  out[0xf] = alVar2;
  out[0x10] = alVar2;
  out[0x11] = alVar2;
  out[0x12] = alVar2;
  out[0x13] = alVar2;
  out[0x14] = alVar2;
  out[0x15] = alVar2;
  out[0x16] = alVar2;
  out[0x17] = alVar2;
  out[0x18] = alVar2;
  out[0x19] = alVar2;
  out[0x1a] = alVar2;
  out[0x1b] = alVar2;
  out[0x1c] = alVar2;
  out[0x1d] = alVar2;
  out[0x1e] = alVar2;
  out[0x1f] = alVar2;
  return;
}

Assistant:

static void idct32_low1_avx2(const __m256i *input, __m256i *output) {
  const int32_t *cospi = cospi_arr(INV_COS_BIT);

  // stage 1
  __m256i x[2];
  x[0] = input[0];

  // stage 2
  // stage 3
  // stage 4
  // stage 5
  btf_16_w16_0_avx2(cospi[32], cospi[32], x[0], x[0], x[1]);

  // stage 6
  // stage 7
  // stage 8
  // stage 9
  output[0] = x[0];
  output[31] = x[0];
  output[1] = x[1];
  output[30] = x[1];
  output[2] = x[1];
  output[29] = x[1];
  output[3] = x[0];
  output[28] = x[0];
  output[4] = x[0];
  output[27] = x[0];
  output[5] = x[1];
  output[26] = x[1];
  output[6] = x[1];
  output[25] = x[1];
  output[7] = x[0];
  output[24] = x[0];
  output[8] = x[0];
  output[23] = x[0];
  output[9] = x[1];
  output[22] = x[1];
  output[10] = x[1];
  output[21] = x[1];
  output[11] = x[0];
  output[20] = x[0];
  output[12] = x[0];
  output[19] = x[0];
  output[13] = x[1];
  output[18] = x[1];
  output[14] = x[1];
  output[17] = x[1];
  output[15] = x[0];
  output[16] = x[0];
}